

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

PermuteLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_permute(NeuralNetworkLayer *this)

{
  bool bVar1;
  PermuteLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_permute(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_permute(this);
    this_00 = (PermuteLayerParams *)operator_new(0x28);
    PermuteLayerParams::PermuteLayerParams(this_00);
    (this->layer_).permute_ = this_00;
  }
  return (PermuteLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::PermuteLayerParams* NeuralNetworkLayer::mutable_permute() {
  if (!has_permute()) {
    clear_layer();
    set_has_permute();
    layer_.permute_ = new ::CoreML::Specification::PermuteLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.permute)
  return layer_.permute_;
}